

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
 __thiscall
Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForWrite
          (Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *this)

{
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  runtime_error *this_00;
  ulong uVar4;
  pointer *__ptr;
  long in_RSI;
  long lVar5;
  long lVar6;
  int *in_R9;
  unique_lock<std::mutex> lock;
  string local_68;
  unique_lock<std::mutex> local_48;
  char local_34 [4];
  
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  if (*(char *)(in_RSI + 0x68) == '\x01') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_34[0] = '&';
    local_34[1] = '\0';
    local_34[2] = '\0';
    local_34[3] = '\0';
    util::str<char[32],char[94],char[2],int>
              (&local_68,(util *)"Assertion `!closed_` failed at ",
               (char (*) [32])
               "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/goesrecv/queue.h"
               ,(char (*) [94])0x1684a2,(char (*) [2])local_34,in_R9);
    std::runtime_error::runtime_error(this_00,(string *)&local_68);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar1 = *(long *)(in_RSI + 0xb8);
  uVar4 = (ulong)(lVar1 - *(long *)(in_RSI + 0x98)) >> 3;
  puVar2 = *(undefined8 **)(in_RSI + 0xa0);
  lVar5 = (long)puVar2 - *(long *)(in_RSI + 0xa8) >> 3;
  plVar3 = *(long **)(in_RSI + 0x80);
  lVar6 = *(long *)(in_RSI + 0x90) - (long)plVar3 >> 3;
  if (((uVar4 - 1) + (ulong)(lVar1 == 0)) * 0x40 + lVar5 + lVar6 == 0) {
    if (*(ulong *)(in_RSI + 0x58) < *(ulong *)(in_RSI + 0x60)) {
      *(ulong *)(in_RSI + 0x58) = *(ulong *)(in_RSI + 0x58) + 1;
      local_68._M_dataplus._M_p = (pointer)operator_new(0x18);
      (((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
       local_68._M_dataplus._M_p)->
      super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
       local_68._M_dataplus._M_p)->
      super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
       local_68._M_dataplus._M_p)->
      super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar2 == (undefined8 *)(*(long *)(in_RSI + 0xb0) + -8)) {
        std::
        deque<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>,std::allocator<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>>>
        ::
        _M_push_back_aux<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>>
                  ((deque<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>,std::allocator<std::unique_ptr<std::vector<std::complex<float>,std::allocator<std::complex<float>>>,std::default_delete<std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>>>
                    *)(in_RSI + 0x70),
                   (unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                    *)&local_68);
        if ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
            local_68._M_dataplus._M_p !=
            (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)0x0) {
          std::
          default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::
          operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                      *)&local_68,
                     (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                     local_68._M_dataplus._M_p);
        }
      }
      else {
        *puVar2 = local_68._M_dataplus._M_p;
        *(long *)(in_RSI + 0xa0) = *(long *)(in_RSI + 0xa0) + 8;
      }
      plVar3 = *(long **)(in_RSI + 0x80);
    }
    else if (((uVar4 - 1) + (ulong)(lVar1 == 0)) * 0x40 + lVar5 + lVar6 == 0) {
      do {
        std::condition_variable::wait((unique_lock *)(in_RSI + 0x28));
        plVar3 = *(long **)(in_RSI + 0x80);
      } while ((*(long *)(in_RSI + 0x90) - (long)plVar3 >> 3) +
               (*(long *)(in_RSI + 0xa0) - *(long *)(in_RSI + 0xa8) >> 3) +
               ((((ulong)(*(long *)(in_RSI + 0xb8) - *(long *)(in_RSI + 0x98)) >> 3) - 1) +
               (ulong)(*(long *)(in_RSI + 0xb8) == 0)) * 0x40 == 0);
    }
  }
  (this->m_).super___mutex_base._M_mutex.__align = *plVar3;
  *plVar3 = 0;
  std::
  deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
  ::pop_front((deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
               *)(in_RSI + 0x70));
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> popForWrite() {
    std::unique_lock<std::mutex> lock(m_);
    ASSERT(!closed_);

    // Ensure there is an item to return
    if (write_.size() == 0) {
      if (elements_ < capacity_) {
        elements_++;
        write_.push_back(std::make_unique<T>());
      } else {
        // Wait until pushRead makes an item available
        while (write_.size() == 0) {
          cv_.wait(lock);
        }
      }
    }

    auto v = std::move(write_.front());
    write_.pop_front();
    return v;
  }